

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Ndr_NtkPrintObjects(Wln_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint local_18;
  int iFanin;
  int iObj;
  int k;
  Wln_Ntk_t *pNtk_local;
  
  printf("Node IDs and their fanins:\n");
  for (local_18 = 1; iVar1 = Wln_NtkObjNum(pNtk), (int)local_18 < iVar1; local_18 = local_18 + 1) {
    printf("%5d = ",(ulong)local_18);
    for (iFanin = 0; iVar1 = Wln_ObjFaninNum(pNtk,local_18), iFanin < iVar1; iFanin = iFanin + 1) {
      uVar2 = Wln_ObjFanin(pNtk,local_18,iFanin);
      if (uVar2 != 0) {
        printf("%5d ",(ulong)uVar2);
      }
    }
    for (; iFanin < 4; iFanin = iFanin + 1) {
      printf("      ");
    }
    uVar2 = Wln_ObjNameId(pNtk,local_18);
    printf("    Name Id %d ",(ulong)uVar2);
    iVar1 = Wln_ObjIsPi(pNtk,local_18);
    if (iVar1 != 0) {
      printf("  pi  ");
    }
    iVar1 = Wln_ObjIsPo(pNtk,local_18);
    if (iVar1 != 0) {
      printf("  po  ");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Ndr_NtkPrintObjects( Wln_Ntk_t * pNtk )
{
    int k, iObj, iFanin;
    printf( "Node IDs and their fanins:\n" );
    Wln_NtkForEachObj( pNtk, iObj )
    {
        printf( "%5d = ", iObj );
        Wln_ObjForEachFanin( pNtk, iObj, iFanin, k )
            printf( "%5d ", iFanin );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wln_ObjNameId(pNtk, iObj) );
        if ( Wln_ObjIsPi(pNtk, iObj) )
            printf( "  pi  " );
        if ( Wln_ObjIsPo(pNtk, iObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}